

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getDigit6(Nibbler *this,int *result)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  intmax_t iVar4;
  char *local_38 [4];
  
  uVar1 = this->_cursor;
  if (5 < this->_length - uVar1 && uVar1 < this->_length) {
    pcVar2 = (this->_input)._M_dataplus._M_p;
    if (((((int)pcVar2[uVar1] - 0x30U < 10) && ((int)pcVar2[uVar1 + 1] - 0x30U < 10)) &&
        ((int)pcVar2[uVar1 + 2] - 0x30U < 10)) &&
       ((((int)pcVar2[uVar1 + 3] - 0x30U < 10 && ((int)pcVar2[uVar1 + 4] - 0x30U < 10)) &&
        ((int)pcVar2[uVar1 + 5] - 0x30U < 10)))) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)this);
      iVar4 = strtoimax(local_38[0],(char **)0x0,10);
      *result = (int)iVar4;
      std::__cxx11::string::~string((string *)local_38);
      this->_cursor = this->_cursor + 6;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool Nibbler::getDigit6 (int& result)
{
  std::string::size_type i = _cursor;
  if (i < _length &&
      _length - i >= 6)
  {
    if (isdigit (_input[i + 0]) &&
        isdigit (_input[i + 1]) &&
        isdigit (_input[i + 2]) &&
        isdigit (_input[i + 3]) &&
        isdigit (_input[i + 4]) &&
        isdigit (_input[i + 5]))
    {
      result = strtoimax (_input.substr (_cursor, 6).c_str (), NULL, 10);
      _cursor += 6;
      return true;
    }
  }

  return false;
}